

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<test_result_(wchar_t)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(wchar_t)> *this)

{
  UntypedFunctionMockerBase *in_RDI;
  FunctionMockerBase<test_result_(wchar_t)> *in_stack_ffffffffffffffd8;
  
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(in_RDI);
  in_RDI->_vptr_UntypedFunctionMockerBase = (_func_int **)&PTR__FunctionMockerBase_00268940;
  MockSpec<test_result_(wchar_t)>::MockSpec
            ((MockSpec<test_result_(wchar_t)> *)in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}